

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_regtest.cc
# Opt level: O0

bool StreqExcept(char *a,char *b,char *except)

{
  char cVar1;
  char cVar2;
  size_t __n;
  void *pvVar3;
  size_t exceptlen;
  char *pb;
  char *pa;
  char *except_local;
  char *b_local;
  char *a_local;
  
  __n = strlen(except);
  pb = a;
  exceptlen = (size_t)b;
  while( true ) {
    while (pvVar3 = memchr(except,(int)*pb,__n), pvVar3 != (void *)0x0) {
      pb = pb + 1;
    }
    while (pvVar3 = memchr(except,(int)*(char *)exceptlen,__n), pvVar3 != (void *)0x0) {
      exceptlen = exceptlen + 1;
    }
    if ((*pb == '\0') && (*(char *)exceptlen == '\0')) break;
    cVar1 = *pb;
    cVar2 = *(char *)exceptlen;
    pb = pb + 1;
    exceptlen = exceptlen + 1;
    if (cVar1 != cVar2) {
      return false;
    }
  }
  return true;
}

Assistant:

bool StreqExcept(const char* a, const char* b, const char* except) {
  const char* pa = a, *pb = b;
  const size_t exceptlen = strlen(except);
  while (1) {
    // Use memchr instead of strchr because strchr(foo, '\0') always fails
    while (memchr(except, *pa, exceptlen))  pa++;   // ignore "except" chars in a
    while (memchr(except, *pb, exceptlen))  pb++;   // ignore "except" chars in b
    if ((*pa == '\0') && (*pb == '\0'))
      return true;
    if (*pa++ != *pb++)                  // includes case where one is at \0
      return false;
  }
}